

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O0

GBufferFilm *
pbrt::GBufferFilm::Create
          (ParameterDictionary *parameters,Float exposureTime,FilterHandle *filter,
          RGBColorSpace *colorSpace,FileLoc *loc,Allocator alloc)

{
  byte bVar1;
  undefined1 uVar2;
  byte bVar3;
  GBufferFilm *pGVar4;
  bool *in_RDI;
  Float FVar5;
  FilmBaseParameters filmBaseParameters;
  PixelSensor *sensor;
  bool writeFP16;
  Float maxComponentValue;
  FileLoc *in_stack_00000300;
  PixelSensor *in_stack_00000308;
  FilterHandle *in_stack_00000310;
  ParameterDictionary *in_stack_00000318;
  FilmBaseParameters *in_stack_00000320;
  string *in_stack_fffffffffffffe68;
  ParameterDictionary *in_stack_fffffffffffffe70;
  undefined6 in_stack_fffffffffffffe78;
  float *args_2;
  RGBColorSpace **args_1;
  FilmBaseParameters *args;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  char *in_stack_fffffffffffffea8;
  bool *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined1 local_121 [33];
  float local_100 [14];
  RGBColorSpace *local_c8;
  string *in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  undefined1 local_91 [36];
  byte local_6d;
  allocator<char> local_59;
  string local_58 [36];
  Float local_34;
  bool *local_10;
  
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
  FVar5 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,0.0);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_91;
  __s = local_10;
  local_34 = FVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,__s,(allocator<char> *)
                      CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
  bVar1 = ParameterDictionary::GetOneBool(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,false)
  ;
  std::__cxx11::string::~string((string *)(local_91 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_91);
  local_6d = bVar1 & 1;
  PixelSensor::Create((ParameterDictionary *)filmBaseParameters.filename._0_8_,
                      (RGBColorSpace *)filmBaseParameters.sensor,(Float)filmBaseParameters._36_4_,
                      (FileLoc *)
                      filmBaseParameters.filter.
                      super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
                      .bits,(Allocator)filmBaseParameters.filename._M_string_length);
  args_2 = local_100;
  FilterHandle::FilterHandle
            ((FilterHandle *)in_stack_fffffffffffffe70,(FilterHandle *)in_stack_fffffffffffffe68);
  FilmBaseParameters::FilmBaseParameters
            (in_stack_00000320,in_stack_00000318,in_stack_00000310,in_stack_00000308,
             in_stack_00000300);
  args_1 = &local_c8;
  args = (FilmBaseParameters *)local_121;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,__s,(allocator<char> *)CONCAT17(bVar1,in_stack_fffffffffffffea0));
  uVar2 = HasExtension(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  bVar3 = uVar2 ^ 0xff;
  std::__cxx11::string::~string((string *)(local_121 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_121);
  if ((bVar3 & 1) == 0) {
    pGVar4 = pstd::pmr::polymorphic_allocator<std::byte>::
             new_object<pbrt::GBufferFilm,pbrt::FilmBaseParameters&,pbrt::RGBColorSpace_const*&,float&,bool&,pstd::pmr::polymorphic_allocator<std::byte>&>
                       ((polymorphic_allocator<std::byte> *)
                        CONCAT17(bVar1,in_stack_fffffffffffffea0),args,args_1,args_2,local_10,
                        (polymorphic_allocator<std::byte> *)
                        CONCAT17(uVar2,CONCAT16(bVar3,in_stack_fffffffffffffe78)));
    FilmBaseParameters::~FilmBaseParameters((FilmBaseParameters *)0x6b43df);
    return pGVar4;
  }
  ErrorExit<std::__cxx11::string&>
            ((FileLoc *)this,__s,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(bVar1,in_stack_fffffffffffffea0));
}

Assistant:

GBufferFilm *GBufferFilm::Create(const ParameterDictionary &parameters,
                                 Float exposureTime, FilterHandle filter,
                                 const RGBColorSpace *colorSpace, const FileLoc *loc,
                                 Allocator alloc) {
    Float maxComponentValue = parameters.GetOneFloat("maxcomponentvalue", Infinity);
    bool writeFP16 = parameters.GetOneBool("savefp16", true);

    PixelSensor *sensor =
        PixelSensor::Create(parameters, colorSpace, exposureTime, loc, alloc);

    FilmBaseParameters filmBaseParameters(parameters, filter, sensor, loc);

    if (!HasExtension(filmBaseParameters.filename, "exr"))
        ErrorExit(loc, "%s: EXR is the only format supported by the GBufferFilm.",
                  filmBaseParameters.filename);

    return alloc.new_object<GBufferFilm>(filmBaseParameters, colorSpace,
                                         maxComponentValue, writeFP16, alloc);
}